

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O2

bool cmExecProgramCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  string *psVar10;
  Encoding in_R9D;
  bool bVar11;
  int iVar12;
  pointer pbVar13;
  bool bVar14;
  string_view value;
  string_view value_00;
  string output_variable;
  string output;
  int retVal;
  string command;
  string return_variable;
  string arguments;
  string coutput;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&coutput,"called with incorrect number of arguments",
               (allocator<char> *)&output);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&coutput);
    bVar14 = false;
  }
  else {
    arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
    arguments._M_string_length = 0;
    arguments.field_2._M_local_buf[0] = '\0';
    output_variable._M_dataplus._M_p = (pointer)&output_variable.field_2;
    output_variable._M_string_length = 0;
    return_variable._M_dataplus._M_p = (pointer)&return_variable.field_2;
    return_variable._M_string_length = 0;
    output_variable.field_2._M_local_buf[0] = '\0';
    return_variable.field_2._M_local_buf[0] = '\0';
    bVar11 = false;
    iVar12 = 0;
    bVar5 = false;
    bVar4 = false;
    for (; bVar14 = pbVar13 == pbVar1, !bVar14; pbVar13 = pbVar13 + 1) {
      bVar3 = std::operator==(pbVar13,"OUTPUT_VARIABLE");
      if (bVar3) {
        iVar12 = iVar12 + 1;
LAB_0026f909:
        bVar11 = false;
LAB_0026f90c:
        bVar5 = false;
      }
      else if (bVar4 == false) {
        bVar4 = std::operator==(pbVar13,"RETURN_VALUE");
        if (bVar4) {
          iVar12 = iVar12 + 1;
          bVar11 = true;
          goto LAB_0026f90c;
        }
        if (bVar11) {
          if (return_variable._M_string_length != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&coutput,"called with incorrect number of arguments",
                       (allocator<char> *)&output);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0026fce7;
          }
          std::__cxx11::string::_M_assign((string *)&return_variable);
        }
        else {
          bVar14 = std::operator==(pbVar13,"ARGS");
          if (!bVar14) {
            if (!bVar5) goto LAB_0026f909;
            std::__cxx11::string::append((string *)&arguments);
            std::__cxx11::string::append((char *)&arguments);
          }
          bVar5 = true;
        }
        iVar12 = iVar12 + 1;
        bVar11 = false;
      }
      else {
        if (output_variable._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&coutput,"called with incorrect number of arguments",
                     (allocator<char> *)&output);
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0026fce7:
          psVar10 = &coutput;
          goto LAB_0026fcef;
        }
        std::__cxx11::string::_M_assign((string *)&output_variable);
        iVar12 = iVar12 + 1;
      }
      bVar4 = bVar3;
    }
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    if (arguments._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&command);
    }
    else {
      cmSystemTools::ConvertToRunCommandPath
                (&local_90,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      coutput._M_dataplus._M_p = (pointer)local_90._M_string_length;
      coutput._M_string_length = (size_type)local_90._M_dataplus._M_p;
      output._M_string_length = (size_type)&output.field_2;
      output._M_dataplus._M_p = (pointer)0x1;
      output.field_2._M_local_buf[0] = ' ';
      cmStrCat<std::__cxx11::string>
                ((string *)&retVal,(cmAlphaNum *)&coutput,(cmAlphaNum *)&output,&arguments);
      std::__cxx11::string::operator=((string *)&command,(string *)&retVal);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::~string((string *)&local_90);
    }
    sVar2 = output_variable._M_string_length;
    retVal = 0;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    pbVar13 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >> 5) - (long)iVar12 == 2
       ) {
      cmsys::SystemTools::MakeDirectory(pbVar13 + 1,(mode_t *)0x0);
      std::__cxx11::string::string((string *)&local_50,(string *)&command);
      bVar5 = anon_unknown.dwarf_8bea01::RunCommand
                        (&local_50,&output,&retVal,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,sVar2 == 0,
                         in_R9D);
      psVar10 = &local_50;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&command);
      bVar5 = anon_unknown.dwarf_8bea01::RunCommand
                        (&local_70,&output,&retVal,(char *)0x0,sVar2 == 0,in_R9D);
      psVar10 = &local_70;
    }
    std::__cxx11::string::~string((string *)psVar10);
    if (bVar5 == false) {
      retVal = -1;
    }
    if (output_variable._M_string_length != 0) {
      uVar6 = std::__cxx11::string::find_first_not_of((char *)&output,0x5cda25);
      lVar7 = std::__cxx11::string::find_last_not_of((char *)&output,0x5cda25);
      if (uVar6 == 0xffffffffffffffff) {
        uVar6 = 0;
      }
      lVar9 = output._M_string_length - 1;
      if (lVar7 != -1) {
        lVar9 = lVar7;
      }
      std::__cxx11::string::string((string *)&coutput,(string *)&output,uVar6,(lVar9 - uVar6) + 1);
      value._M_str = coutput._M_dataplus._M_p;
      value._M_len = coutput._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&output_variable,value);
      std::__cxx11::string::~string((string *)&coutput);
    }
    if (return_variable._M_string_length != 0) {
      snprintf((char *)&coutput,100,"%d",(ulong)(uint)retVal);
      this = status->Makefile;
      sVar8 = strlen((char *)&coutput);
      value_00._M_str = (char *)&coutput;
      value_00._M_len = sVar8;
      cmMakefile::AddDefinition(this,&return_variable,value_00);
    }
    std::__cxx11::string::~string((string *)&output);
    psVar10 = &command;
LAB_0026fcef:
    std::__cxx11::string::~string((string *)psVar10);
    std::__cxx11::string::~string((string *)&return_variable);
    std::__cxx11::string::~string((string *)&output_variable);
    std::__cxx11::string::~string((string *)&arguments);
  }
  return bVar14;
}

Assistant:

bool cmExecProgramCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmStrCat(cmSystemTools::ConvertToRunCommandPath(args[0]), ' ',
                       arguments);
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = RunCommand(command, output, retVal, args[1].c_str(), verbose);
  } else {
    result = RunCommand(command, output, retVal, nullptr, verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    status.GetMakefile().AddDefinition(output_variable, coutput);
  }

  if (!return_variable.empty()) {
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%d", retVal);
    status.GetMakefile().AddDefinition(return_variable, buffer);
  }

  return true;
}